

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VEnableScaleVectorArray_Serial(N_Vector v,int tf)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = -1;
  if ((v != (N_Vector)0x0) && (v->ops != (N_Vector_Ops)0x0)) {
    iVar1 = 0;
    if (tf == 0) {
      pcVar2 = (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0;
    }
    else {
      pcVar2 = N_VScaleVectorArray_Serial;
    }
    v->ops->nvscalevectorarray = pcVar2;
  }
  return iVar1;
}

Assistant:

int N_VEnableScaleVectorArray_Serial(N_Vector v, booleantype tf)
{
  /* check that vector is non-NULL */
  if (v == NULL) return(-1);

  /* check that ops structure is non-NULL */
  if (v->ops == NULL) return(-1);

  /* enable/disable operation */
  if (tf)
    v->ops->nvscalevectorarray = N_VScaleVectorArray_Serial;
  else
    v->ops->nvscalevectorarray = NULL;

  /* return success */
  return(0);
}